

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS
ref_metric_gradation_at_complexity_mixed
          (REF_DBL *metric,REF_GRID ref_grid,REF_DBL gradation,REF_DBL complexity)

{
  REF_NODE pRVar1;
  REF_GLOB *pRVar2;
  uint uVar3;
  int iVar4;
  undefined8 uVar5;
  REF_DBL *pRVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  REF_DBL RVar10;
  REF_DBL current_complexity;
  uint local_84;
  double local_80;
  int local_74;
  double local_70;
  REF_DBL local_68;
  REF_DBL *local_58;
  REF_DBL local_50;
  double local_48;
  
  pRVar1 = ref_grid->node;
  if (pRVar1->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x478,
           "ref_metric_gradation_at_complexity_mixed","malloc metric_imply of REF_DBL negative");
    local_84 = 1;
  }
  else {
    local_70 = *(double *)(&DAT_00232570 + (ulong)(ref_grid->twod == 0) * 8);
    local_48 = complexity;
    if (complexity <= -complexity) {
      local_48 = -complexity;
    }
    local_58 = metric + 5;
    iVar4 = 0;
    local_68 = complexity;
    local_50 = gradation;
    do {
      local_74 = iVar4;
      uVar3 = ref_metric_complexity(metric,ref_grid,&local_80);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x480,"ref_metric_gradation_at_complexity_mixed",(ulong)uVar3,"cmp");
        return uVar3;
      }
      dVar9 = local_80 * 1e+20;
      if (dVar9 <= -dVar9) {
        dVar9 = -dVar9;
      }
      if (dVar9 <= local_48) {
        return 4;
      }
      if (0 < pRVar1->max) {
        lVar8 = 0;
        pRVar6 = metric;
        do {
          if (-1 < pRVar1->global[lVar8]) {
            lVar7 = 0;
            do {
              dVar9 = pow(local_68 / local_80,local_70);
              pRVar6[lVar7] = dVar9 * pRVar6[lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar7 != 6);
            if (ref_grid->twod != 0) {
              metric[lVar8 * 6 + 2] = 0.0;
              metric[lVar8 * 6 + 4] = 0.0;
              metric[lVar8 * 6 + 5] = 1.0;
            }
          }
          lVar8 = lVar8 + 1;
          pRVar6 = pRVar6 + 6;
        } while (lVar8 < pRVar1->max);
      }
      uVar3 = ref_metric_imply_non_tet(metric,ref_grid);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x48f,"ref_metric_gradation_at_complexity_mixed",(ulong)uVar3,"imply non tet");
        return uVar3;
      }
      if (1.0 <= local_50) {
        uVar3 = ref_metric_metric_space_gradation(metric,ref_grid,local_50);
        if (uVar3 != 0) {
          uVar5 = 0x495;
          goto LAB_00188bb4;
        }
      }
      else {
        uVar3 = ref_metric_mixed_space_gradation(metric,ref_grid,-1.0,-1.0);
        if (uVar3 != 0) {
          uVar5 = 0x492;
LAB_00188bb4:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 uVar5,"ref_metric_gradation_at_complexity_mixed",(ulong)uVar3,"gradation");
          local_84 = uVar3;
        }
      }
      if (uVar3 != 0) {
        return local_84;
      }
      if ((ref_grid->twod != 0) && (iVar4 = pRVar1->max, 0 < (long)iVar4)) {
        pRVar2 = pRVar1->global;
        lVar8 = 0;
        pRVar6 = local_58;
        do {
          if (-1 < pRVar2[lVar8]) {
            pRVar6[-3] = 0.0;
            pRVar6[-1] = 0.0;
            *pRVar6 = 1.0;
          }
          lVar8 = lVar8 + 1;
          pRVar6 = pRVar6 + 6;
        } while (iVar4 != lVar8);
      }
      iVar4 = local_74 + 1;
    } while (iVar4 != 0x14);
    local_84 = ref_metric_complexity(metric,ref_grid,&local_80);
    if (local_84 == 0) {
      dVar9 = local_80 * 1e+20;
      if (dVar9 <= -dVar9) {
        dVar9 = -dVar9;
      }
      RVar10 = local_68;
      if (local_68 <= -local_68) {
        RVar10 = -local_68;
      }
      local_84 = 4;
      if (RVar10 < dVar9) {
        if (pRVar1->max < 1) {
          local_84 = 0;
        }
        else {
          lVar8 = 0;
          pRVar6 = metric;
          do {
            if (-1 < pRVar1->global[lVar8]) {
              lVar7 = 0;
              do {
                dVar9 = pow(local_68 / local_80,local_70);
                pRVar6[lVar7] = dVar9 * pRVar6[lVar7];
                lVar7 = lVar7 + 1;
              } while (lVar7 != 6);
              if (ref_grid->twod != 0) {
                metric[lVar8 * 6 + 2] = 0.0;
                metric[lVar8 * 6 + 4] = 0.0;
                metric[lVar8 * 6 + 5] = 1.0;
              }
            }
            lVar8 = lVar8 + 1;
            pRVar6 = pRVar6 + 6;
            local_84 = 0;
          } while (lVar8 < pRVar1->max);
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x49f,"ref_metric_gradation_at_complexity_mixed",(ulong)local_84,"cmp");
    }
  }
  return local_84;
}

Assistant:

REF_FCN REF_STATUS ref_metric_gradation_at_complexity_mixed(
    REF_DBL *metric, REF_GRID ref_grid, REF_DBL gradation, REF_DBL complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT relaxations;
  REF_DBL current_complexity;
  REF_DBL complexity_scale;
  REF_INT node, i;
  REF_DBL *metric_imply;

  ref_malloc(metric_imply, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);

  complexity_scale = 2.0 / 3.0;
  if (ref_grid_twod(ref_grid)) {
    complexity_scale = 1.0;
  }

  for (relaxations = 0; relaxations < 20; relaxations++) {
    RSS(ref_metric_complexity(metric, ref_grid, &current_complexity), "cmp");
    if (!ref_math_divisible(complexity, current_complexity)) {
      return REF_DIV_ZERO;
    }
    each_ref_node_valid_node(ref_node, node) {
      for (i = 0; i < 6; i++) {
        metric[i + 6 * node] *=
            pow(complexity / current_complexity, complexity_scale);
      }
      if (ref_grid_twod(ref_grid)) {
        metric[2 + 6 * node] = 0.0;
        metric[4 + 6 * node] = 0.0;
        metric[5 + 6 * node] = 1.0;
      }
    }
    RSS(ref_metric_imply_non_tet(metric, ref_grid), "imply non tet");
    if (gradation < 1.0) {
      RSS(ref_metric_mixed_space_gradation(metric, ref_grid, -1.0, -1.0),
          "gradation");
    } else {
      RSS(ref_metric_metric_space_gradation(metric, ref_grid, gradation),
          "gradation");
    }
    if (ref_grid_twod(ref_grid)) {
      each_ref_node_valid_node(ref_node, node) {
        metric[2 + 6 * node] = 0.0;
        metric[4 + 6 * node] = 0.0;
        metric[5 + 6 * node] = 1.0;
      }
    }
  }
  RSS(ref_metric_complexity(metric, ref_grid, &current_complexity), "cmp");
  if (!ref_math_divisible(complexity, current_complexity)) {
    return REF_DIV_ZERO;
  }
  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] *=
          pow(complexity / current_complexity, complexity_scale);
    }
    if (ref_grid_twod(ref_grid)) {
      metric[2 + 6 * node] = 0.0;
      metric[4 + 6 * node] = 0.0;
      metric[5 + 6 * node] = 1.0;
    }
  }

  ref_free(metric_imply) return REF_SUCCESS;
}